

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eigen.h
# Opt level: O0

handle pybind11::detail::
       eigen_array_cast<pybind11::detail::EigenProps<Eigen::Matrix<double,1,2,1,1,2>>>
                 (Type *src,handle base,bool writeable)

{
  Index IVar1;
  Scalar *ptr;
  PyObject **ppPVar2;
  PyArray_Proxy *pPVar3;
  handle hVar4;
  long local_b0;
  initializer_list<long> local_a8;
  any_container<long> local_98;
  Index local_70;
  initializer_list<long> local_68;
  any_container<long> local_58;
  array local_40;
  handle local_38;
  array a;
  ssize_t elem_size;
  bool writeable_local;
  Type *src_local;
  handle base_local;
  
  a.super_buffer.super_object.super_handle.m_ptr = (buffer)(object)0x8;
  array::array((array *)&local_38);
  local_70 = Eigen::EigenBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>::size
                       ((EigenBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_> *)src);
  local_68._M_array = &local_70;
  local_68._M_len = 1;
  any_container<long>::any_container<long,void>(&local_58,&local_68);
  IVar1 = Eigen::Matrix<double,_1,_2,_1,_1,_2>::innerStride(src);
  local_b0 = IVar1 << 3;
  local_a8._M_array = &local_b0;
  local_a8._M_len = 1;
  any_container<long>::any_container<long,void>(&local_98,&local_a8);
  ptr = Eigen::PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>::data
                  (&src->super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>);
  array::array<double>(&local_40,&local_58,&local_98,ptr,base);
  array::operator=((array *)&local_38,&local_40);
  array::~array(&local_40);
  any_container<long>::~any_container(&local_98);
  any_container<long>::~any_container(&local_58);
  if (!writeable) {
    ppPVar2 = handle::ptr(&local_38);
    pPVar3 = array_proxy(*ppPVar2);
    pPVar3->flags = pPVar3->flags & 0xfffffbff;
  }
  hVar4 = pybind11::object::release((object *)&local_38);
  array::~array((array *)&local_38);
  return (handle)hVar4.m_ptr;
}

Assistant:

handle eigen_array_cast(typename props::Type const &src, handle base = handle(), bool writeable = true) {
    constexpr ssize_t elem_size = sizeof(typename props::Scalar);
    array a;
    if (props::vector)
        a = array({ src.size() }, { elem_size * src.innerStride() }, src.data(), base);
    else
        a = array({ src.rows(), src.cols() }, { elem_size * src.rowStride(), elem_size * src.colStride() },
                  src.data(), base);

    if (!writeable)
        array_proxy(a.ptr())->flags &= ~detail::npy_api::NPY_ARRAY_WRITEABLE_;

    return a.release();
}